

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::scale(btSoftBody *this,btVector3 *scl)

{
  int iVar1;
  btCollisionShape *pbVar2;
  Node *pNVar3;
  btVector3 *in_RSI;
  btSoftBody *in_RDI;
  btSoftBody *unaff_retaddr;
  btSoftBody *in_stack_00000020;
  Node *n;
  int ni;
  int i;
  btDbvtVolume vol;
  btScalar margin;
  btDbvtVolume *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  btScalar in_stack_ffffffffffffffac;
  btDbvt *in_stack_ffffffffffffffb0;
  int local_38;
  
  pbVar2 = btCollisionObject::getCollisionShape(&in_RDI->super_btCollisionObject);
  (*pbVar2->_vptr_btCollisionShape[0xc])();
  btDbvtAabbMm::btDbvtAabbMm((btDbvtAabbMm *)in_RDI);
  local_38 = 0;
  iVar1 = btAlignedObjectArray<btSoftBody::Node>::size(&in_RDI->m_nodes);
  for (; local_38 < iVar1; local_38 = local_38 + 1) {
    pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[](&in_RDI->m_nodes,local_38);
    btVector3::operator*=(&pNVar3->m_x,in_RSI);
    btVector3::operator*=(&pNVar3->m_q,in_RSI);
    btDbvtAabbMm::FromCR((btVector3 *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    btDbvt::update(in_stack_ffffffffffffffb0,
                   (btDbvtNode *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                   in_stack_ffffffffffffffa0);
  }
  updateNormals(unaff_retaddr);
  updateBounds(in_stack_00000020);
  updateConstants(in_RDI);
  return;
}

Assistant:

void			btSoftBody::scale(const btVector3& scl)
{

	const btScalar	margin=getCollisionShape()->getMargin();
	ATTRIBUTE_ALIGNED16(btDbvtVolume)	vol;
	
	for(int i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		n.m_x*=scl;
		n.m_q*=scl;
		vol = btDbvtVolume::FromCR(n.m_x,margin);
		m_ndbvt.update(n.m_leaf,vol);
	}
	updateNormals();
	updateBounds();
	updateConstants();
}